

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmObjByteArray::save_to_file(CVmObjByteArray *this,CVmFile *fp)

{
  uchar *buf;
  undefined8 in_RSI;
  int v;
  CVmFile *in_RDI;
  uchar *p;
  size_t chunk;
  size_t avail;
  unsigned_long idx;
  unsigned_long rem;
  CVmFile *in_stack_ffffffffffffffd0;
  CVmFile *in_stack_ffffffffffffffd8;
  CVmObjByteArray *this_00;
  CVmFile *local_18;
  
  v = (int)((ulong)in_RSI >> 0x20);
  get_element_count((CVmObjByteArray *)0x2c6146);
  CVmFile::write_int4(in_RDI,v);
  this_00 = (CVmObjByteArray *)0x1;
  for (local_18 = (CVmFile *)get_element_count((CVmObjByteArray *)0x2c6164);
      local_18 != (CVmFile *)0x0;
      local_18 = (CVmFile *)((long)local_18 - (long)in_stack_ffffffffffffffd0)) {
    buf = get_ele_ptr(this_00,(unsigned_long)in_stack_ffffffffffffffd8,
                      (size_t *)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd8;
    if (local_18 < in_stack_ffffffffffffffd8) {
      in_stack_ffffffffffffffd0 = local_18;
    }
    CVmFile::write_bytes(in_stack_ffffffffffffffd0,(char *)buf,(size_t)in_RDI);
    this_00 = (CVmObjByteArray *)
              ((long)&(this_00->super_CVmObject)._vptr_CVmObject +
              (long)&in_stack_ffffffffffffffd0->fp_);
  }
  return;
}

Assistant:

void CVmObjByteArray::save_to_file(VMG_ class CVmFile *fp)
{
    unsigned long rem;
    unsigned long idx;
    
    /* write the element count */
    fp->write_int4(get_element_count());

    /* write the bytes in chunks */
    for (idx = 1, rem = get_element_count() ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk;
        unsigned char *p;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this copy to the remaining bytes */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* write this chunk */
        fp->write_bytes((char *)p, chunk);

        /* advance past this chunk */
        idx += chunk;
        rem -= chunk;
    }
}